

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_swap_Test::~VectorSUnitTest_swap_Test(VectorSUnitTest_swap_Test *this)

{
  VectorSUnitTest_swap_Test *this_local;
  
  ~VectorSUnitTest_swap_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, swap)
{
    // NOTE: The reason for using different capacities here
    //       is to exercise the mixed-capacity constructors, assigment
    //       and equality functions/operators.
    vector_s<unsigned, 12> original_v1{0u, 1u, 2u, 3u, 4u, 5u};
    vector_s<unsigned, 11>  original_v2{0u, 1u, 2u};
    vector_s<unsigned, 10> v1 = original_v1;
    vector_s<unsigned, 9>  v2 = original_v2;

    EXPECT_EQ(6u, v1.size());
    EXPECT_EQ(3u, v2.size());
    v1.swap(v2);
    EXPECT_EQ(6u, v2.size());
    EXPECT_EQ(3u, v1.size());
    EXPECT_EQ(v1, original_v2);
    EXPECT_EQ(v2, original_v1);
}